

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

void sexp_init_context_globals(sexp ctx)

{
  sexp psVar1;
  sexp psVar2;
  undefined8 ctx_00;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp feature;
  sexp print;
  sexp_conflict *vec;
  sexp type;
  int endianess_check;
  int i;
  char **features;
  sexp in_stack_ffffffffffffffa8;
  sexp_conflict *in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  sexp ctx_01;
  sexp dflt;
  undefined8 len;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 name;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffec;
  char **data;
  
  uVar3 = 1;
  len = (sexp)0x0;
  dflt = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb8,0,0x10);
  psVar1 = sexp_make_vector_op((sexp)CONCAT44(in_stack_ffffffffffffffec,uVar3),
                               (sexp)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(sexp)len,
                               dflt);
  (in_RDI->value).type.setters = psVar1;
  psVar1 = sexp_make_vector_op((sexp)CONCAT44(in_stack_ffffffffffffffec,uVar3),
                               (sexp)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(sexp)len,
                               dflt);
  (((in_RDI->value).type.setters)->value).type.cpl = psVar1;
  (((in_RDI->value).type.setters)->value).context.mark_stack[6].start = (sexp_conflict *)0x3e;
  (((in_RDI->value).type.setters)->value).context.mark_stack[6].end = (sexp_conflict *)0x3e;
  (((in_RDI->value).type.setters)->value).context.mark_stack[6].prev = (sexp_mark_stack_ptr_t *)0x3e
  ;
  (((in_RDI->value).type.setters)->value).context.mark_stack[8].start = (sexp_conflict *)0x23e;
  (((in_RDI->value).type.setters)->value).context.mark_stack[7].start = (sexp_conflict *)0x3e;
  (((in_RDI->value).type.setters)->value).context.mark_stack[7].end = (sexp_conflict *)0x3e;
  (((in_RDI->value).type.setters)->value).context.mark_stack[7].prev = (sexp_mark_stack_ptr_t *)0x1;
  psVar1 = sexp_user_exception((sexp)vec,print,(char *)feature,(sexp)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).type.print = psVar1;
  psVar1 = sexp_user_exception((sexp)vec,print,(char *)feature,(sexp)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).type.dl = psVar1;
  psVar1 = sexp_user_exception((sexp)vec,print,(char *)feature,(sexp)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).type.finalize_name = psVar1;
  psVar1 = sexp_user_exception((sexp)vec,print,(char *)feature,(sexp)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).opcode.methods = psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[0].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[0].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[0].prev =
       (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[1].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[1].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[1].prev =
       (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[2].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[2].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[3].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[3].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[3].prev =
       (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[4].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).context.mark_stack[4].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_alloc_tagged_aux
                     (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                      (sexp_uint_t)in_stack_ffffffffffffffb0);
  (((in_RDI->value).type.setters)->value).context.mark_stack[2].prev =
       (sexp_mark_stack_ptr_t *)psVar1;
  ((((in_RDI->value).type.setters)->value).context.mark_stack[2].prev)->end = (sexp_conflict *)0x0;
  (((in_RDI->value).type.setters)->value).bytecode.max_depth = 0x23e;
  sexp_push_op(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((((in_RDI->value).type.setters)->value).type.setters)->value).type.name = psVar1;
  psVar1 = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
  (((in_RDI->value).type.setters)->value).type.slots = psVar1;
  psVar1 = (sexp)&stack0xffffffffffffffc8;
  ctx_01 = (sexp)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb8;
  for (data = sexp_initial_features; *data != (char *)0x0; data = (char **)&((sexp)data)->value) {
    dflt = sexp_intern(print,(char *)feature,(sexp_sint_t)__sexp_gc_preserver1.next);
    psVar2 = sexp_memq_op(in_RDI,(sexp)0x0,2,dflt,
                          (((in_RDI->value).type.setters)->value).type.setters);
    if (psVar2 == (sexp)&DAT_0000003e) {
      sexp_push_op(psVar1,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      (((((in_RDI->value).type.setters)->value).type.setters)->value).type.name = dflt;
    }
  }
  (in_RDI->value).context.saves = (sexp_gc_var_t *)ctx_01;
  (((in_RDI->value).type.setters)->value).type.id = (sexp)0x53;
  psVar2 = sexp_make_vector_op((sexp)CONCAT44(in_stack_ffffffffffffffec,uVar3),
                               (sexp)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(sexp)len,
                               dflt);
  (((in_RDI->value).type.setters)->value).type.getters = psVar2;
  name = (long)&((((in_RDI->value).type.setters)->value).type.getters)->value + 8;
  uVar3 = 0;
  while (((int)uVar3 < 0x29 &&
         (ctx_00 = sexp_alloc_tagged_aux
                             (ctx_01,(size_t)psVar1,(sexp_uint_t)in_stack_ffffffffffffffb0),
         (sexp)ctx_00 != (sexp)0x0))) {
    memcpy(&((sexp)ctx_00)->value,_sexp_type_specs + (int)uVar3,0x70);
    *(undefined8 *)(&((sexp)name)->tag + (long)(int)uVar3 * 2) = ctx_00;
    psVar2 = sexp_c_string(dflt,(char *)ctx_01,(sexp_sint_t)psVar1);
    (((sexp)ctx_00)->value).type.name = psVar2;
    if ((((sexp)ctx_00)->value).type.finalize_name != (sexp)0x0) {
      psVar2 = sexp_c_string(dflt,(char *)ctx_01,(sexp_sint_t)psVar1);
      (((sexp)ctx_00)->value).type.finalize_name = psVar2;
    }
    if ((((sexp)ctx_00)->value).type.print != (sexp)0x0) {
      if (((sexp)len == (sexp)0x0) ||
         ((((sexp)ctx_00)->value).type.print != (sexp)(((sexp)len)->value).opcode.func)) {
        len = sexp_make_foreign((sexp)ctx_00,(char *)name,SUB84(len,4),(int)len,(char *)dflt,
                                (sexp_proc1)ctx_01,(sexp)data);
        (((sexp)ctx_00)->value).type.print = (sexp)len;
      }
      else {
        (((sexp)ctx_00)->value).port.offset = len;
      }
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void sexp_init_context_globals (sexp ctx) {
  const char** features;
  int i, endianess_check = 1;
  sexp type, *vec, print=NULL;
  sexp_gc_var1(feature);
  sexp_context_globals(ctx)
    = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_G_NUM_GLOBALS), SEXP_VOID);
#if ! SEXP_USE_GLOBAL_SYMBOLS
  sexp_global(ctx, SEXP_G_SYMBOLS) = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_SYMBOL_TABLE_SIZE), SEXP_NULL);
#endif
  sexp_global(ctx, SEXP_G_STRICT_P) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_NO_TAIL_CALLS_P) = SEXP_FALSE;
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_global(ctx, SEXP_G_FOLD_CASE_P) = sexp_make_boolean(SEXP_DEFAULT_FOLD_CASE_SYMS);
#endif
#if ! SEXP_USE_BOEHM
  sexp_global(ctx, SEXP_G_PRESERVATIVES) = SEXP_NULL;
#endif
#if SEXP_USE_WEAK_REFERENCES
  sexp_global(ctx, SEXP_G_WEAK_OBJECTS_PRESENT) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_FILE_DESCRIPTORS) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_NUM_FILE_DESCRIPTORS) = SEXP_ZERO;
#endif
  sexp_global(ctx, SEXP_G_OOM_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "out of memory", SEXP_NULL);
  sexp_global(ctx, SEXP_G_OOS_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "out of stack space", SEXP_NULL);
  sexp_global(ctx, SEXP_G_ABI_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "incompatible ABI", SEXP_NULL);
  sexp_global(ctx, SEXP_G_INTERRUPT_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "interrupt", SEXP_NULL);
  sexp_global(ctx, SEXP_G_QUOTE_SYMBOL) = sexp_intern(ctx, "quote", -1);
  sexp_global(ctx, SEXP_G_QUASIQUOTE_SYMBOL) = sexp_intern(ctx, "quasiquote", -1);
  sexp_global(ctx, SEXP_G_UNQUOTE_SYMBOL) = sexp_intern(ctx, "unquote", -1);
  sexp_global(ctx, SEXP_G_UNQUOTE_SPLICING_SYMBOL) = sexp_intern(ctx, "unquote-splicing", -1);
  sexp_global(ctx, SEXP_G_SYNTAX_SYMBOL) = sexp_intern(ctx, "syntax", -1);
  sexp_global(ctx, SEXP_G_QUASISYNTAX_SYMBOL) = sexp_intern(ctx, "quasisyntax", -1);
  sexp_global(ctx, SEXP_G_UNSYNTAX_SYMBOL) = sexp_intern(ctx, "unsyntax", -1);
  sexp_global(ctx, SEXP_G_UNSYNTAX_SPLICING_SYMBOL) = sexp_intern(ctx, "unsyntax-splicing", -1);
  sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL) = sexp_intern(ctx, "current-input-port", -1);
  sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL) = sexp_intern(ctx, "current-output-port", -1);
  sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL) = sexp_intern(ctx, "current-error-port", -1);
  sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL) = sexp_intern(ctx, "interaction-environment", -1);
  sexp_global(ctx, SEXP_G_CONTINUABLE_SYMBOL) = sexp_intern(ctx, "continuable", -1);
  sexp_global(ctx, SEXP_G_EMPTY_VECTOR) = sexp_alloc_type(ctx, vector, SEXP_VECTOR);
  sexp_vector_length(sexp_global(ctx, SEXP_G_EMPTY_VECTOR)) = 0;
  sexp_global(ctx, SEXP_G_FEATURES) = SEXP_NULL;
  sexp_push(ctx, sexp_global(ctx, SEXP_G_FEATURES), SEXP_FALSE);
  sexp_car(sexp_global(ctx, SEXP_G_FEATURES)) = sexp_intern(ctx, (*(unsigned char*) &endianess_check) ? "little-endian" : "big-endian", -1);
  sexp_global(ctx, SEXP_G_ENDIANNESS) = sexp_intern(ctx, (*(unsigned char*) &endianess_check) ? "little" : "big", -1);
  sexp_gc_preserve1(ctx, feature);
  for (features=sexp_initial_features; *features; features++) {
    feature = sexp_intern(ctx, *features, -1);
    if (sexp_not(sexp_memq(ctx, feature, sexp_global(ctx, SEXP_G_FEATURES)))) {
      sexp_push(ctx, sexp_global(ctx, SEXP_G_FEATURES), SEXP_FALSE);
      sexp_car(sexp_global(ctx, SEXP_G_FEATURES)) = feature;
    }
  }
  sexp_gc_release1(ctx);
  sexp_global(ctx, SEXP_G_NUM_TYPES) = sexp_make_fixnum(SEXP_NUM_CORE_TYPES);
  sexp_global(ctx, SEXP_G_TYPES)
    = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_INIT_NUM_TYPES), SEXP_VOID);
  vec = sexp_vector_data(sexp_global(ctx, SEXP_G_TYPES));
  for (i=0; i<SEXP_NUM_CORE_TYPES; i++) {
    type = sexp_alloc_type(ctx, type, SEXP_TYPE);
    if (!type) {
      return; /* TODO - fundamental OOM, what to do here? */
    }
    memcpy(&(type->value), &(_sexp_type_specs[i]), sizeof(_sexp_type_specs[0]));
    vec[i] = type;
    sexp_type_name(type) = sexp_c_string(ctx, (char*)sexp_type_name(type), -1);
    if (sexp_type_finalize_name(type)) {
      sexp_type_finalize_name(type) = sexp_c_string(ctx, (char*)sexp_type_finalize_name(type), -1);
    }
    if (sexp_type_print(type)) {
      if (print && ((sexp_proc1)sexp_type_print(type) == sexp_opcode_func(print)))
        sexp_type_print(type) = print;
      else
        sexp_type_print(type) = print = sexp_make_foreign(ctx, "sexp_write_simple_object", 3, 0, NULL, (sexp_proc1)sexp_type_print(type), NULL);
    }
  }
}